

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_manager.cc
# Opt level: O3

RC __thiscall RM_Manager::OpenFile(RM_Manager *this,char *fileName,RM_FileHandle *fileHandle)

{
  RC RVar1;
  RC RVar2;
  PF_PageHandle *this_00;
  PageNum page;
  PF_PageHandle ph;
  PF_FileHandle fh;
  char *pData;
  PageNum local_64;
  PF_PageHandle local_60;
  PF_FileHandle local_50;
  RM_FileHeader *local_30;
  
  if (fileName == (char *)0x0) {
    RVar1 = 0x6f;
  }
  else {
    RVar1 = 0x6b;
    if (fileHandle->openedFH == false) {
      PF_FileHandle::PF_FileHandle(&local_50);
      RVar1 = PF_Manager::OpenFile(this->pfm,fileName,&local_50);
      if (RVar1 == 0) {
        PF_PageHandle::PF_PageHandle(&local_60);
        RVar1 = PF_FileHandle::GetFirstPage(&local_50,&local_60);
        RVar2 = PF_PageHandle::GetPageNum(&local_60,&local_64);
        if (RVar2 == 0) {
          this_00 = &local_60;
          PF_PageHandle::GetData(this_00,(char **)&local_30);
          RVar2 = SetUpFH((RM_Manager *)this_00,fileHandle,&local_50,local_30);
          RVar1 = PF_FileHandle::UnpinPage(&local_50,local_64);
          if (RVar1 == 0) {
            if (RVar2 == 0) {
              RVar1 = 0;
            }
            else {
              PF_Manager::CloseFile(this->pfm,&local_50);
              RVar1 = RVar2;
            }
          }
        }
        else {
          PF_FileHandle::UnpinPage(&local_50,local_64);
          PF_Manager::CloseFile(this->pfm,&local_50);
        }
        PF_PageHandle::~PF_PageHandle(&local_60);
      }
      PF_FileHandle::~PF_FileHandle(&local_50);
    }
  }
  return RVar1;
}

Assistant:

RC RM_Manager::OpenFile   (const char *fileName, RM_FileHandle &fileHandle){
  if(fileName == NULL)
    return (RM_BADFILENAME);
  // if the filehandle is associated with another open file. exit immediately
  if(fileHandle.openedFH == true)
    return (RM_INVALIDFILEHANDLE);

  RC rc;
  // Open the file
  PF_FileHandle fh;
  if((rc = pfm.OpenFile(fileName, fh)))
    return (rc);

  // Gets the first page, and uses it to set up the header in fileHandle
  PF_PageHandle ph;
  PageNum page;
  if((rc = fh.GetFirstPage(ph)) || (ph.GetPageNum(page))){
    fh.UnpinPage(page);
    pfm.CloseFile(fh);
    return (rc);
  }
  char *pData;
  ph.GetData(pData);
  struct RM_FileHeader * header = (struct RM_FileHeader *) pData;

  // set up and validate the header of this file
  rc = SetUpFH(fileHandle, fh, header);

  // Unpin the header page
  RC rc2;
  if((rc2 = fh.UnpinPage(page)))
    return (rc2);

  // If any errors occured, close the file!
  if(rc != 0){
    pfm.CloseFile(fh);
  }
  return (rc); 
}